

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O3

mat3 * dja::operator*(mat3 *__return_storage_ptr__,float_t s,mat3 *m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  
  uVar4 = m->m[0].x;
  uVar7 = m->m[0].y;
  uVar5 = m->m[1].x;
  uVar8 = m->m[1].y;
  uVar6 = m->m[2].x;
  uVar9 = m->m[2].y;
  fVar1 = m->m[0].z;
  fVar2 = m->m[1].z;
  fVar3 = m->m[2].z;
  __return_storage_ptr__->m[0].x = (float)uVar4 * s;
  __return_storage_ptr__->m[0].y = (float)uVar7 * s;
  __return_storage_ptr__->m[0].z = fVar1 * s;
  __return_storage_ptr__->m[1].x = (float)uVar5 * s;
  __return_storage_ptr__->m[1].y = (float)uVar8 * s;
  __return_storage_ptr__->m[1].z = fVar2 * s;
  __return_storage_ptr__->m[2].x = (float)uVar6 * s;
  __return_storage_ptr__->m[2].y = (float)uVar9 * s;
  __return_storage_ptr__->m[2].z = s * fVar3;
  return __return_storage_ptr__;
}

Assistant:

mat3 operator*(const float_t s, const mat3& m)
{
    return mat3(s * m[0], s * m[1], s * m[2]);
}